

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::TEST_CompactMemTable(DBImpl *this)

{
  long *in_RSI;
  
  (**(code **)(*in_RSI + 0x20))();
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    std::mutex::lock((mutex *)&((pthread_mutex_t *)(in_RSI + 0x19))->__data);
    while (in_RSI[0x27] != 0) {
      if (((Status *)(in_RSI + 0x46))->state_ != (char *)0x0) {
        Status::operator=((Status *)this,(Status *)(in_RSI + 0x46));
        break;
      }
      port::CondVar::Wait((CondVar *)(in_RSI + 0x1f));
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x19));
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::TEST_CompactMemTable() {
  // nullptr batch means just wait for earlier writes to be done
  Status s = Write(WriteOptions(), nullptr);
  if (s.ok()) {
    // Wait until the compaction completes
    MutexLock l(&mutex_);
    while (imm_ != nullptr && bg_error_.ok()) {
      background_work_finished_signal_.Wait();
    }
    if (imm_ != nullptr) {
      s = bg_error_;
    }
  }
  return s;
}